

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O2

fork_status srunner_fork_status(SRunner *sr)

{
  fork_status fVar1;
  char *pcVar2;
  
  if (sr->fstat != CK_FORK_GETENV) {
    return sr->fstat;
  }
  pcVar2 = getenv("CK_FORK");
  fVar1 = CK_FORK;
  if (((pcVar2 != (char *)0x0) && (*pcVar2 == 'n')) && (pcVar2[1] == 'o')) {
    fVar1 = (pcVar2[2] == '\0') + CK_FORK;
  }
  return fVar1;
}

Assistant:

enum fork_status srunner_fork_status(SRunner * sr)
{
    if(sr->fstat == CK_FORK_GETENV)
    {
        char *env = getenv("CK_FORK");

        if(env == NULL)
#if defined(HAVE_FORK) && HAVE_FORK==1
            return CK_FORK;
#else
            return CK_NOFORK;
#endif
        if(strcmp(env, "no") == 0)
            return CK_NOFORK;
#if defined(HAVE_FORK) && HAVE_FORK==1
        return CK_FORK;
#else /* HAVE_FORK */
        /* Ignoring, as Check is not compiled with fork support. */
        return CK_NOFORK;
#endif /* HAVE_FORK */
    }
    return sr->fstat;
}